

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O0

char * apprun_argv_to_env(char **string_list)

{
  uint uVar1;
  size_t sVar2;
  char *__dest;
  uint local_2c;
  int i_1;
  char *str;
  int i;
  uint extra_chars_len;
  uint str_size;
  uint string_list_len;
  char **string_list_local;
  
  uVar1 = apprun_string_list_len(string_list);
  i = 0;
  for (str._0_4_ = 0; (uint)str < uVar1; str._0_4_ = (uint)str + 1) {
    sVar2 = strlen(string_list[(int)(uint)str]);
    i = i + (int)sVar2 + 3;
  }
  __dest = (char *)calloc((ulong)(i + 1),1);
  memset(__dest,0,(ulong)(i + 1));
  for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
    strcat(__dest,"\"");
    strcat(__dest,string_list[(int)local_2c]);
    strcat(__dest,"\"");
    if (local_2c + 1 < uVar1) {
      strcat(__dest," ");
    }
  }
  return __dest;
}

Assistant:

char *apprun_argv_to_env(char *const *string_list) {
    unsigned string_list_len = apprun_string_list_len(string_list);
    unsigned str_size = 0;

    // space required by two quotation marks and one space
    const unsigned extra_chars_len = 3;

    for (int i = 0; i < string_list_len; i++)
        str_size += strlen(string_list[i]) + extra_chars_len;

    char *str = calloc(str_size + 1, sizeof(char));
    memset(str, 0, str_size + 1);

    for (int i = 0; i < string_list_len; i++) {
        strcat(str, "\"");
        strcat(str, string_list[i]);
        strcat(str, "\"");
        if (i + 1 < string_list_len)
            strcat(str, " ");
    }

    return str;
}